

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGuiListClipper_SeekCursorForItem(ImGuiListClipper *clipper,int item_n)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  ImGuiWindow *pIVar5;
  ImGuiOldColumns *pIVar6;
  ImGuiTable *table;
  float fVar7;
  ImGuiContext *pIVar8;
  uint uVar9;
  float fVar10;
  
  pIVar8 = GImGui;
  fVar1 = clipper->ItemsHeight;
  fVar7 = fVar1 * (float)(item_n - *(int *)((long)clipper->TempData + 0x10)) +
          *(float *)((long)clipper->TempData + 8) + clipper->StartPosY;
  pIVar5 = GImGui->CurrentWindow;
  fVar2 = (pIVar5->DC).CursorPos.y;
  (pIVar5->DC).CursorPos.y = fVar7;
  fVar3 = (pIVar5->DC).CursorMaxPos.y;
  fVar4 = (pIVar8->Style).ItemSpacing.y;
  fVar10 = fVar7 - fVar4;
  uVar9 = -(uint)(fVar10 <= fVar3);
  (pIVar5->DC).CursorMaxPos.y = (float)(uVar9 & (uint)fVar3 | ~uVar9 & (uint)fVar10);
  (pIVar5->DC).CursorPosPrevLine.y = fVar7 - fVar1;
  (pIVar5->DC).PrevLineSize.y = fVar1 - fVar4;
  pIVar6 = (pIVar5->DC).CurrentColumns;
  if (pIVar6 != (ImGuiOldColumns *)0x0) {
    pIVar6->LineMinY = fVar7;
  }
  table = pIVar8->CurrentTable;
  if (table != (ImGuiTable *)0x0) {
    if (table->IsInsideRow == true) {
      ImGui::TableEndRow(table);
    }
    table->RowPosY2 = (pIVar5->DC).CursorPos.y;
    table->RowBgColorCounter = table->RowBgColorCounter + (int)((fVar7 - fVar2) / fVar1 + 0.5);
  }
  return;
}

Assistant:

static void ImGuiListClipper_SeekCursorForItem(ImGuiListClipper* clipper, int item_n)
{
    // StartPosY starts from ItemsFrozen hence the subtraction
    // Perform the add and multiply with double to allow seeking through larger ranges
    ImGuiListClipperData* data = (ImGuiListClipperData*)clipper->TempData;
    float pos_y = (float)((double)clipper->StartPosY + data->LossynessOffset + (double)(item_n - data->ItemsFrozen) * clipper->ItemsHeight);
    ImGuiListClipper_SeekCursorAndSetupPrevLine(pos_y, clipper->ItemsHeight);
}